

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopUBXThreadubloxx(UBLOX *publox)

{
  int local_1c;
  int id;
  UBLOX *publox_local;
  
  local_1c = 0;
  do {
    if ((UBLOX *)addrsublox[local_1c] == publox) {
      bExitUBXublox[local_1c] = 1;
      WaitForThread(ubloxUBXThreadId[local_1c]);
      DeleteCriticalSection(ubloxCS + local_1c);
      resublox[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopUBXThreadubloxx(UBLOX* publox)
{
	int id = 0;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitUBXublox[id] = TRUE;
	WaitForThread(ubloxUBXThreadId[id]);
	DeleteCriticalSection(&ubloxCS[id]);
	resublox[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}